

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IdleDecommitPageAllocator.cpp
# Opt level: O3

DWORD __thiscall Memory::IdleDecommitPageAllocator::IdleDecommit(IdleDecommitPageAllocator *this)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  DWORD DVar4;
  uint uVar5;
  ThreadContextId pvVar6;
  uint uVar7;
  DWORD DVar8;
  undefined8 *in_FS_OFFSET;
  
  DVar8 = 0xffffffff;
  if (this->hasDecommitTimer == true) {
    bVar3 = CCLock::TryEnter(&(this->cs).super_CCLock);
    if (bVar3) {
      this->idleDecommitTryEnterWaitFactor = 0;
      if (this->hasDecommitTimer == true) {
        if ((this->super_PageAllocator).maxFreePageCount != this->maxIdleDecommitFreePageCount) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar1 = (undefined4 *)*in_FS_OFFSET;
          *puVar1 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/IdleDecommitPageAllocator.cpp"
                             ,0xfc,"(this->maxFreePageCount == maxIdleDecommitFreePageCount)",
                             "this->maxFreePageCount == maxIdleDecommitFreePageCount");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar1 = 0;
        }
        DVar8 = this->decommitTime;
        DVar4 = GetTickCount();
        DVar8 = DVar8 - DVar4;
        if ((int)DVar8 < 0x14) {
          bVar3 = Js::Phases::IsEnabled
                            (&((this->super_PageAllocator).pageAllocatorFlagTable)->Trace,
                             PageAllocatorPhase);
          if (bVar3) {
            pvVar6 = JsUtil::ExternalApi::GetCurrentThreadContextId();
            DVar8 = GetCurrentThreadId();
            Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar6,(ulong)DVar8,this);
            if ((this->super_PageAllocator).debugName != (char16 *)0x0) {
              Output::Print(L"[%s] ");
            }
            Output::Print(L"IdleDecommit");
            Output::Print(L"\n");
            Output::Flush();
          }
          this->idleDecommitCount = this->idleDecommitCount + 1;
          PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
          ::DecommitNow(&this->super_PageAllocator,true);
          this->hasDecommitTimer = false;
          PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
          ::ClearMinFreePageCount(&this->super_PageAllocator);
          (this->super_PageAllocator).maxFreePageCount = this->maxNonIdleDecommitFreePageCount;
          DVar8 = 0xffffffff;
        }
      }
      CCLock::Leave(&(this->cs).super_CCLock);
    }
    else {
      bVar3 = Js::Phases::IsEnabled
                        (&((this->super_PageAllocator).pageAllocatorFlagTable)->Trace,
                         PageAllocatorPhase);
      if (bVar3) {
        pvVar6 = JsUtil::ExternalApi::GetCurrentThreadContextId();
        DVar8 = GetCurrentThreadId();
        Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar6,(ulong)DVar8,this);
        if ((this->super_PageAllocator).debugName != (char16 *)0x0) {
          Output::Print(L"[%s] ");
        }
        Output::Print(L"IdleDecommit Retry");
        Output::Print(L"\n");
        Output::Flush();
      }
      uVar5 = this->idleDecommitTryEnterWaitFactor + 1;
      uVar7 = 1;
      if (uVar5 < 10) {
        uVar7 = uVar5;
      }
      this->idleDecommitTryEnterWaitFactor = uVar7;
      DVar8 = uVar7 * 0xb;
    }
  }
  return DVar8;
}

Assistant:

DWORD
IdleDecommitPageAllocator::IdleDecommit()
{
    // We can check hasDecommitTimer outside of the lock because when it change to true
    // the Recycler::concurrentIdleDecommitEvent will signal and we try to IdleDecommit again
    // If it change to false, we check again when we acquired the lock
    if (!hasDecommitTimer)
    {
        return INFINITE;
    }
    if (!cs.TryEnter())
    {
        // Failed to acquire the lock, wait for a variable time.
        PAGE_ALLOC_TRACE(_u("IdleDecommit Retry"));

        // Varies the wait time between 11 - 99
        idleDecommitTryEnterWaitFactor++;
        if (idleDecommitTryEnterWaitFactor >= 10)
        {
            idleDecommitTryEnterWaitFactor = 1;
        }
        DWORD waitTime = 11 * idleDecommitTryEnterWaitFactor;
        return waitTime;      // Retry time
    }
    idleDecommitTryEnterWaitFactor = 0;
    DWORD waitTime = INFINITE;
    if (hasDecommitTimer)
    {
        Assert(this->maxFreePageCount == maxIdleDecommitFreePageCount);
        int timediff = (int)(decommitTime - ::GetTickCount());
        if (timediff >= 20)   // Ignore time diff is it is < 20 since the system timer doesn't have that high of precision anyways
        {
            waitTime = (DWORD)timediff;
        }
        else
        {
            // Do the decommit in normal priority so that we don't block the main thread for too long
            PAGE_ALLOC_TRACE(_u("IdleDecommit"));
#if DBG_DUMP
            idleDecommitCount++;
#endif
            __super::DecommitNow();
            hasDecommitTimer = false;
            ClearMinFreePageCount();
            this->maxFreePageCount = maxNonIdleDecommitFreePageCount;
        }
    }
    cs.Leave();
    return waitTime;
}